

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcmesh.cpp
# Opt level: O2

int __thiscall TPZCompMesh::InsertMaterialObject(TPZCompMesh *this,TPZMaterial *mat)

{
  iterator iVar1;
  mapped_type *ppTVar2;
  int matid;
  
  if (mat == (TPZMaterial *)0x0) {
    return -1;
  }
  matid = (**(code **)(*(long *)mat + 0x58))(mat);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_TPZMaterial_*>,_std::_Select1st<std::pair<const_int,_TPZMaterial_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
          ::find(&(this->fMaterialVec)._M_t,&matid);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->fMaterialVec)._M_t._M_impl.super__Rb_tree_header)
  {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcmesh.cpp",
               0x170);
  }
  ppTVar2 = std::
            map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
            ::operator[](&this->fMaterialVec,&matid);
  *ppTVar2 = mat;
  return (int)(this->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

int TPZCompMesh::InsertMaterialObject(TPZMaterial * mat) {
	if(!mat) return -1;
	int matid = mat->Id();
    if (fMaterialVec.find(matid) != fMaterialVec.end()) {
        DebugStop();
    }
	fMaterialVec[matid] = mat;
	return fMaterialVec.size();
}